

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
     *this,int i)

{
  double dVar1;
  Fad<double> *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_> *pFVar3;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar4;
  double *pdVar5;
  value_type vVar6;
  
  vVar6 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::dx(&this->left_->fadexpr_,i);
  pFVar2 = this->right_;
  dVar1 = pFVar2->val_;
  pdVar5 = &pFVar2->defaultVal;
  if ((pFVar2->dx_).num_elts != 0) {
    pdVar5 = (pFVar2->dx_).ptr_to_data + i;
  }
  pFVar3 = (this->left_->fadexpr_).left_;
  pFVar4 = (this->left_->fadexpr_).right_;
  return (vVar6 * dVar1 -
         (((pFVar4->fadexpr_).left_)->val_ * ((pFVar4->fadexpr_).right_)->val_ -
         ((((pFVar3->fadexpr_).left_)->fadexpr_).expr_)->val_ * ((pFVar3->fadexpr_).right_)->val_) *
         *pdVar5) / (dVar1 * dVar1);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}